

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

float wlapv(qnode_ptr_t p,int x,int y,float a,float c)

{
  int iVar1;
  disp_field512_t *padVar2;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Db;
  
  padVar2 = p->flow_ptr;
  iVar1 = p->res;
  return ((*padVar2)[iVar1 * x + y + -1].y + (*padVar2)[iVar1 * x + 1 + y].y) *
         (float)(double)CONCAT44(in_XMM1_Db,c) +
         ((*padVar2)[(x + -1) * iVar1 + y].y + (*padVar2)[(x + 1) * iVar1 + y].y) *
         (float)(double)CONCAT44(in_XMM0_Db,a);
}

Assistant:

float wlapv(p,x,y,a,c)
qnode_ptr_t p ;
int x, y ;
float a, c ;

{ float d ;

  d = a*((*p->flow_ptr)[p->res*(x-1) + y].y +
  (*p->flow_ptr)[p->res*(x+1) + y].y) +
  c*((*p->flow_ptr)[p->res*x + (y-1)].y +
  (*p->flow_ptr)[p->res*x + (y+1)].y) ;
  return(d) ;
}